

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfp_helper.c
# Opt level: O3

void dfp_check_for_VXISI(PPC_DFP *dfp,int testForSameSign)

{
  uint uVar1;
  decClass dVar2;
  decClass dVar3;
  
  if (((((dfp->context).status & 0x80) != 0) && (((dfp->a).bits & 0x40) != 0)) &&
     (((dfp->b).bits & 0x40) != 0)) {
    dVar2 = decNumberClass((decNumber_conflict *)&dfp->a,&dfp->context);
    dVar3 = decNumberClass((decNumber_conflict *)&dfp->b,&dfp->context);
    if ((testForSameSign != 0) == (dVar2 == dVar3)) {
      uVar1 = dfp->env->fpscr;
      dfp->env->fpscr = (uint)((char)uVar1 < '\0') << 0x1e | uVar1 | 0xa0800000;
    }
  }
  return;
}

Assistant:

static void dfp_check_for_VXISI(struct PPC_DFP *dfp, int testForSameSign)
{
    if (dfp->context.status & DEC_Invalid_operation) {
        if (decNumberIsInfinite(&dfp->a) && decNumberIsInfinite(&dfp->b)) {
            int same = decNumberClass(&dfp->a, &dfp->context) ==
                       decNumberClass(&dfp->b, &dfp->context);
            if ((same && testForSameSign) || (!same && !testForSameSign)) {
                dfp_set_FPSCR_flag(dfp, FP_VX | FP_VXISI, FP_VE);
            }
        }
    }
}